

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx::
     BVHNIntersector1<4,_16777232,_true,_embree::avx::ArrayIntersector1<embree::avx::TriangleMiMBIntersector1Pluecker<4,_true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float *pfVar1;
  undefined8 *puVar2;
  float *pfVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar6;
  Scene *pSVar7;
  Geometry *pGVar8;
  RTCIntersectArguments *pRVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  bool bVar19;
  undefined1 auVar20 [16];
  AABBNodeMB4D *node1;
  ulong uVar21;
  ulong uVar22;
  long lVar23;
  long lVar24;
  undefined4 uVar25;
  ulong unaff_RBX;
  size_t mask;
  int iVar26;
  ulong uVar27;
  long lVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  size_t sVar32;
  ulong uVar33;
  uint uVar34;
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  ulong uVar39;
  bool bVar40;
  float fVar48;
  float fVar49;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  float fVar50;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  float fVar91;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  float fVar92;
  float fVar93;
  float fVar102;
  float fVar103;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  float fVar104;
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  float fVar105;
  float fVar106;
  float fVar112;
  float fVar114;
  undefined1 auVar107 [16];
  float fVar116;
  undefined1 auVar108 [16];
  float fVar113;
  float fVar115;
  float fVar117;
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  float fVar135;
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  float fVar133;
  float fVar134;
  undefined1 auVar132 [64];
  float fVar136;
  float fVar137;
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar145;
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  float fVar146;
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  float fVar147;
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  float fVar152;
  float fVar154;
  float fVar155;
  float fVar156;
  float fVar157;
  undefined1 auVar153 [16];
  float fVar158;
  undefined1 auVar159 [16];
  float fVar160;
  float fVar161;
  float fVar163;
  float fVar164;
  float fVar165;
  float fVar166;
  undefined1 auVar162 [16];
  float fVar167;
  float fVar168;
  float fVar169;
  float fVar171;
  float fVar172;
  undefined1 auVar170 [16];
  float fVar173;
  UVIdentity<4> mapUV;
  float local_b18;
  float fStack_b14;
  float fStack_b10;
  float fStack_b0c;
  float local_b08;
  float fStack_b04;
  float fStack_b00;
  float fStack_afc;
  Scene *scene;
  int local_acc;
  float local_ac8;
  float fStack_ac4;
  float fStack_ac0;
  float fStack_abc;
  undefined1 local_ab8 [16];
  ulong local_aa0;
  ulong local_a98;
  ulong local_a90;
  ulong local_a88;
  ulong local_a80;
  ulong local_a78;
  NodeRef *local_a70;
  undefined1 local_a68 [16];
  undefined1 local_a58 [8];
  float fStack_a50;
  float fStack_a4c;
  undefined1 local_a48 [8];
  float fStack_a40;
  float fStack_a3c;
  ulong local_a38;
  ulong local_a30;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  float local_928;
  float fStack_924;
  float fStack_920;
  float fStack_91c;
  float local_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  float local_908;
  float fStack_904;
  float fStack_900;
  float fStack_8fc;
  float local_8f8;
  float fStack_8f4;
  float fStack_8f0;
  float fStack_8ec;
  float local_8e8;
  float fStack_8e4;
  float fStack_8e0;
  float fStack_8dc;
  float local_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  undefined8 local_8a8;
  undefined8 uStack_8a0;
  undefined8 local_898;
  undefined8 uStack_890;
  undefined1 local_888 [16];
  undefined1 local_878 [16];
  undefined1 local_868 [16];
  UVIdentity<4> *local_858;
  undefined1 local_848 [16];
  undefined1 local_838 [16];
  undefined1 local_828 [16];
  undefined1 local_818 [16];
  undefined1 local_808 [16];
  undefined1 local_7f8 [16];
  undefined1 local_7e8 [16];
  NodeRef stack [244];
  
  auVar20 = mm_lookupmask_ps._240_16_;
  if ((*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) &&
     (fVar93 = ray->tfar, 0.0 <= fVar93)) {
    local_a70 = stack + 1;
    aVar6 = (ray->dir).field_0;
    auVar42 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
    auVar75._8_4_ = 0x7fffffff;
    auVar75._0_8_ = 0x7fffffff7fffffff;
    auVar75._12_4_ = 0x7fffffff;
    auVar75 = vandps_avx((undefined1  [16])aVar6,auVar75);
    auVar94._8_4_ = 0x219392ef;
    auVar94._0_8_ = 0x219392ef219392ef;
    auVar94._12_4_ = 0x219392ef;
    auVar75 = vcmpps_avx(auVar75,auVar94,1);
    auVar95._8_4_ = 0x3f800000;
    auVar95._0_8_ = &DAT_3f8000003f800000;
    auVar95._12_4_ = 0x3f800000;
    auVar94 = vdivps_avx(auVar95,(undefined1  [16])aVar6);
    auVar96._8_4_ = 0x5d5e0b6b;
    auVar96._0_8_ = 0x5d5e0b6b5d5e0b6b;
    auVar96._12_4_ = 0x5d5e0b6b;
    auVar75 = vblendvps_avx(auVar94,auVar96,auVar75);
    stack[0].ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
    auVar76._0_4_ = auVar75._0_4_ * 0.99999964;
    auVar76._4_4_ = auVar75._4_4_ * 0.99999964;
    auVar76._8_4_ = auVar75._8_4_ * 0.99999964;
    auVar76._12_4_ = auVar75._12_4_ * 0.99999964;
    auVar59._0_4_ = auVar75._0_4_ * 1.0000004;
    auVar59._4_4_ = auVar75._4_4_ * 1.0000004;
    auVar59._8_4_ = auVar75._8_4_ * 1.0000004;
    auVar59._12_4_ = auVar75._12_4_ * 1.0000004;
    uVar4 = *(undefined4 *)&(ray->org).field_0;
    local_a68._4_4_ = uVar4;
    local_a68._0_4_ = uVar4;
    local_a68._8_4_ = uVar4;
    local_a68._12_4_ = uVar4;
    auVar132 = ZEXT1664(local_a68);
    uVar4 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
    uVar5 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
    auVar95 = vshufps_avx(auVar76,auVar76,0);
    auVar75 = vmovshdup_avx(auVar76);
    auVar96 = vshufps_avx(auVar76,auVar76,0x55);
    auVar94 = vshufpd_avx(auVar76,auVar76,1);
    auVar16 = vshufps_avx(auVar76,auVar76,0xaa);
    auVar17 = vshufps_avx(auVar59,auVar59,0);
    auVar18 = vshufps_avx(auVar59,auVar59,0x55);
    auVar59 = vshufps_avx(auVar59,auVar59,0xaa);
    uVar33 = (ulong)(auVar76._0_4_ < 0.0) << 4;
    uVar29 = (ulong)(auVar75._0_4_ < 0.0) << 4 | 0x20;
    uVar30 = (ulong)(auVar94._0_4_ < 0.0) << 4 | 0x40;
    uVar36 = uVar33 ^ 0x10;
    uVar38 = uVar29 ^ 0x10;
    uVar35 = uVar30 ^ 0x10;
    auVar75 = vshufps_avx(auVar42,auVar42,0);
    auVar94 = vshufps_avx(ZEXT416((uint)fVar93),ZEXT416((uint)fVar93),0);
    local_aa0 = uVar35;
    local_a98 = uVar38;
    local_a90 = uVar36;
    local_a88 = uVar30;
    local_a80 = uVar29;
    local_a78 = uVar33;
    do {
      if (local_a70 == stack) {
        return;
      }
      sVar32 = local_a70[-1].ptr;
      local_a70 = local_a70 + -1;
      do {
        if ((sVar32 & 8) == 0) {
          uVar21 = sVar32 & 0xfffffffffffffff0;
          fVar93 = (ray->dir).field_0.m128[3];
          auVar41._4_4_ = fVar93;
          auVar41._0_4_ = fVar93;
          auVar41._8_4_ = fVar93;
          auVar41._12_4_ = fVar93;
          pfVar3 = (float *)(uVar21 + 0x80 + uVar33);
          pfVar1 = (float *)(uVar21 + 0x20 + uVar33);
          auVar42._0_4_ = fVar93 * *pfVar3 + *pfVar1;
          auVar42._4_4_ = fVar93 * pfVar3[1] + pfVar1[1];
          auVar42._8_4_ = fVar93 * pfVar3[2] + pfVar1[2];
          auVar42._12_4_ = fVar93 * pfVar3[3] + pfVar1[3];
          auVar42 = vsubps_avx(auVar42,auVar132._0_16_);
          local_8d8 = auVar95._0_4_;
          fStack_8d4 = auVar95._4_4_;
          fStack_8d0 = auVar95._8_4_;
          fStack_8cc = auVar95._12_4_;
          auVar51._0_4_ = auVar42._0_4_ * local_8d8;
          auVar51._4_4_ = auVar42._4_4_ * fStack_8d4;
          auVar51._8_4_ = auVar42._8_4_ * fStack_8d0;
          auVar51._12_4_ = auVar42._12_4_ * fStack_8cc;
          auVar42 = vmaxps_avx(auVar75,auVar51);
          pfVar3 = (float *)(uVar21 + 0x80 + uVar29);
          pfVar1 = (float *)(uVar21 + 0x20 + uVar29);
          auVar60._0_4_ = fVar93 * *pfVar3 + *pfVar1;
          auVar60._4_4_ = fVar93 * pfVar3[1] + pfVar1[1];
          auVar60._8_4_ = fVar93 * pfVar3[2] + pfVar1[2];
          auVar60._12_4_ = fVar93 * pfVar3[3] + pfVar1[3];
          auVar122._4_4_ = uVar4;
          auVar122._0_4_ = uVar4;
          auVar122._8_4_ = uVar4;
          auVar122._12_4_ = uVar4;
          auVar76 = vsubps_avx(auVar60,auVar122);
          local_8e8 = auVar96._0_4_;
          fStack_8e4 = auVar96._4_4_;
          fStack_8e0 = auVar96._8_4_;
          fStack_8dc = auVar96._12_4_;
          auVar61._0_4_ = auVar76._0_4_ * local_8e8;
          auVar61._4_4_ = auVar76._4_4_ * fStack_8e4;
          auVar61._8_4_ = auVar76._8_4_ * fStack_8e0;
          auVar61._12_4_ = auVar76._12_4_ * fStack_8dc;
          pfVar3 = (float *)(uVar21 + 0x80 + uVar30);
          pfVar1 = (float *)(uVar21 + 0x20 + uVar30);
          auVar77._0_4_ = fVar93 * *pfVar3 + *pfVar1;
          auVar77._4_4_ = fVar93 * pfVar3[1] + pfVar1[1];
          auVar77._8_4_ = fVar93 * pfVar3[2] + pfVar1[2];
          auVar77._12_4_ = fVar93 * pfVar3[3] + pfVar1[3];
          auVar123._4_4_ = uVar5;
          auVar123._0_4_ = uVar5;
          auVar123._8_4_ = uVar5;
          auVar123._12_4_ = uVar5;
          auVar76 = vsubps_avx(auVar77,auVar123);
          local_8f8 = auVar16._0_4_;
          fStack_8f4 = auVar16._4_4_;
          fStack_8f0 = auVar16._8_4_;
          fStack_8ec = auVar16._12_4_;
          auVar78._0_4_ = auVar76._0_4_ * local_8f8;
          auVar78._4_4_ = auVar76._4_4_ * fStack_8f4;
          auVar78._8_4_ = auVar76._8_4_ * fStack_8f0;
          auVar78._12_4_ = auVar76._12_4_ * fStack_8ec;
          auVar76 = vmaxps_avx(auVar61,auVar78);
          auVar42 = vmaxps_avx(auVar42,auVar76);
          pfVar3 = (float *)(uVar21 + 0x80 + uVar36);
          pfVar1 = (float *)(uVar21 + 0x20 + uVar36);
          auVar62._0_4_ = fVar93 * *pfVar3 + *pfVar1;
          auVar62._4_4_ = fVar93 * pfVar3[1] + pfVar1[1];
          auVar62._8_4_ = fVar93 * pfVar3[2] + pfVar1[2];
          auVar62._12_4_ = fVar93 * pfVar3[3] + pfVar1[3];
          auVar76 = vsubps_avx(auVar62,auVar132._0_16_);
          local_908 = auVar17._0_4_;
          fStack_904 = auVar17._4_4_;
          fStack_900 = auVar17._8_4_;
          fStack_8fc = auVar17._12_4_;
          auVar63._0_4_ = auVar76._0_4_ * local_908;
          auVar63._4_4_ = auVar76._4_4_ * fStack_904;
          auVar63._8_4_ = auVar76._8_4_ * fStack_900;
          auVar63._12_4_ = auVar76._12_4_ * fStack_8fc;
          pfVar3 = (float *)(uVar21 + 0x80 + uVar38);
          auVar76 = vminps_avx(auVar94,auVar63);
          pfVar1 = (float *)(uVar21 + 0x20 + uVar38);
          auVar79._0_4_ = fVar93 * *pfVar3 + *pfVar1;
          auVar79._4_4_ = fVar93 * pfVar3[1] + pfVar1[1];
          auVar79._8_4_ = fVar93 * pfVar3[2] + pfVar1[2];
          auVar79._12_4_ = fVar93 * pfVar3[3] + pfVar1[3];
          auVar122 = vsubps_avx(auVar79,auVar122);
          pfVar3 = (float *)(uVar21 + 0x80 + uVar35);
          pfVar1 = (float *)(uVar21 + 0x20 + uVar35);
          auVar97._0_4_ = fVar93 * *pfVar3 + *pfVar1;
          auVar97._4_4_ = fVar93 * pfVar3[1] + pfVar1[1];
          auVar97._8_4_ = fVar93 * pfVar3[2] + pfVar1[2];
          auVar97._12_4_ = fVar93 * pfVar3[3] + pfVar1[3];
          local_918 = auVar18._0_4_;
          fStack_914 = auVar18._4_4_;
          fStack_910 = auVar18._8_4_;
          fStack_90c = auVar18._12_4_;
          auVar80._0_4_ = auVar122._0_4_ * local_918;
          auVar80._4_4_ = auVar122._4_4_ * fStack_914;
          auVar80._8_4_ = auVar122._8_4_ * fStack_910;
          auVar80._12_4_ = auVar122._12_4_ * fStack_90c;
          auVar122 = vsubps_avx(auVar97,auVar123);
          local_928 = auVar59._0_4_;
          fStack_924 = auVar59._4_4_;
          fStack_920 = auVar59._8_4_;
          fStack_91c = auVar59._12_4_;
          auVar98._0_4_ = auVar122._0_4_ * local_928;
          auVar98._4_4_ = auVar122._4_4_ * fStack_924;
          auVar98._8_4_ = auVar122._8_4_ * fStack_920;
          auVar98._12_4_ = auVar122._12_4_ * fStack_91c;
          auVar122 = vminps_avx(auVar80,auVar98);
          auVar76 = vminps_avx(auVar76,auVar122);
          if (((uint)sVar32 & 7) == 6) {
            auVar76 = vcmpps_avx(auVar42,auVar76,2);
            auVar42 = vcmpps_avx(*(undefined1 (*) [16])(uVar21 + 0xe0),auVar41,2);
            auVar122 = vcmpps_avx(auVar41,*(undefined1 (*) [16])(uVar21 + 0xf0),1);
            auVar42 = vandps_avx(auVar42,auVar122);
            auVar42 = vandps_avx(auVar42,auVar76);
          }
          else {
            auVar42 = vcmpps_avx(auVar42,auVar76,2);
          }
          auVar42 = vpslld_avx(auVar42,0x1f);
          uVar25 = vmovmskps_avx(auVar42);
          unaff_RBX = CONCAT44((int)(unaff_RBX >> 0x20),uVar25);
        }
        if ((sVar32 & 8) == 0) {
          if (unaff_RBX == 0) {
            iVar26 = 4;
          }
          else {
            uVar21 = sVar32 & 0xfffffffffffffff0;
            lVar23 = 0;
            if (unaff_RBX != 0) {
              for (; (unaff_RBX >> lVar23 & 1) == 0; lVar23 = lVar23 + 1) {
              }
            }
            iVar26 = 0;
            sVar32 = *(size_t *)(uVar21 + lVar23 * 8);
            uVar27 = unaff_RBX - 1 & unaff_RBX;
            if (uVar27 != 0) {
              local_a70->ptr = sVar32;
              lVar23 = 0;
              if (uVar27 != 0) {
                for (; (uVar27 >> lVar23 & 1) == 0; lVar23 = lVar23 + 1) {
                }
              }
              uVar22 = uVar27 - 1;
              while( true ) {
                local_a70 = local_a70 + 1;
                sVar32 = *(size_t *)(uVar21 + lVar23 * 8);
                uVar22 = uVar22 & uVar27;
                if (uVar22 == 0) break;
                local_a70->ptr = sVar32;
                lVar23 = 0;
                if (uVar22 != 0) {
                  for (; (uVar22 >> lVar23 & 1) == 0; lVar23 = lVar23 + 1) {
                  }
                }
                uVar27 = uVar22 - 1;
              }
            }
          }
        }
        else {
          iVar26 = 6;
        }
      } while (iVar26 == 0);
      if (iVar26 == 6) {
        iVar26 = 0;
        local_a38 = (ulong)((uint)sVar32 & 0xf) - 8;
        bVar40 = local_a38 != 0;
        if (bVar40) {
          uVar33 = sVar32 & 0xfffffffffffffff0;
          pSVar7 = context->scene;
          local_a30 = 0;
          do {
            lVar28 = local_a30 * 0x50;
            pGVar8 = (pSVar7->geometries).items[*(uint *)(uVar33 + 0x30 + lVar28)].ptr;
            fVar93 = (pGVar8->time_range).lower;
            fVar93 = pGVar8->fnumTimeSegments *
                     (((ray->dir).field_0.m128[3] - fVar93) / ((pGVar8->time_range).upper - fVar93))
            ;
            auVar42 = vroundss_avx(ZEXT416((uint)fVar93),ZEXT416((uint)fVar93),9);
            auVar42 = vminss_avx(auVar42,ZEXT416((uint)(pGVar8->fnumTimeSegments + -1.0)));
            auVar79 = vmaxss_avx(ZEXT816(0),auVar42);
            lVar24 = (long)(int)auVar79._0_4_ * 0x38;
            uVar39 = (ulong)*(uint *)(uVar33 + 4 + lVar28);
            lVar23 = *(long *)(*(long *)&pGVar8[2].numPrimitives + lVar24);
            lVar24 = *(long *)(*(long *)&pGVar8[2].numPrimitives + 0x38 + lVar24);
            auVar42 = *(undefined1 (*) [16])(lVar23 + (ulong)*(uint *)(uVar33 + lVar28) * 4);
            uVar36 = (ulong)*(uint *)(uVar33 + 0x10 + lVar28);
            auVar76 = *(undefined1 (*) [16])(lVar23 + uVar36 * 4);
            uVar29 = (ulong)*(uint *)(uVar33 + 0x20 + lVar28);
            auVar43 = *(undefined1 (*) [16])(lVar23 + uVar29 * 4);
            auVar122 = *(undefined1 (*) [16])(lVar23 + uVar39 * 4);
            uVar30 = (ulong)*(uint *)(uVar33 + 0x14 + lVar28);
            auVar123 = *(undefined1 (*) [16])(lVar23 + uVar30 * 4);
            uVar38 = (ulong)*(uint *)(uVar33 + 0x24 + lVar28);
            auVar44 = *(undefined1 (*) [16])(lVar23 + uVar38 * 4);
            uVar37 = (ulong)*(uint *)(uVar33 + 8 + lVar28);
            auVar41 = *(undefined1 (*) [16])(lVar23 + uVar37 * 4);
            uVar22 = (ulong)*(uint *)(uVar33 + 0x18 + lVar28);
            auVar51 = *(undefined1 (*) [16])(lVar23 + uVar22 * 4);
            uVar21 = (ulong)*(uint *)(uVar33 + 0x28 + lVar28);
            auVar60 = *(undefined1 (*) [16])(lVar23 + uVar21 * 4);
            uVar35 = (ulong)*(uint *)(uVar33 + 0xc + lVar28);
            auVar61 = *(undefined1 (*) [16])(lVar23 + uVar35 * 4);
            uVar31 = (ulong)*(uint *)(uVar33 + 0x1c + lVar28);
            auVar62 = *(undefined1 (*) [16])(lVar23 + uVar31 * 4);
            uVar27 = (ulong)*(uint *)(uVar33 + 0x2c + lVar28);
            auVar63 = *(undefined1 (*) [16])(lVar23 + uVar27 * 4);
            auVar77 = *(undefined1 (*) [16])(lVar24 + (ulong)*(uint *)(uVar33 + lVar28) * 4);
            auVar78 = *(undefined1 (*) [16])(lVar24 + uVar36 * 4);
            fVar93 = fVar93 - auVar79._0_4_;
            auVar79 = vunpcklps_avx(auVar42,auVar41);
            auVar41 = vunpckhps_avx(auVar42,auVar41);
            auVar80 = vunpcklps_avx(auVar122,auVar61);
            auVar122 = vunpckhps_avx(auVar122,auVar61);
            auVar42 = *(undefined1 (*) [16])(lVar24 + uVar39 * 4);
            auVar97 = vunpcklps_avx(auVar41,auVar122);
            auVar98 = vunpcklps_avx(auVar79,auVar80);
            auVar41 = vunpckhps_avx(auVar79,auVar80);
            auVar61 = vunpcklps_avx(auVar76,auVar51);
            auVar122 = vunpckhps_avx(auVar76,auVar51);
            auVar51 = vunpcklps_avx(auVar123,auVar62);
            auVar123 = vunpckhps_avx(auVar123,auVar62);
            auVar76 = *(undefined1 (*) [16])(lVar24 + uVar37 * 4);
            auVar62 = vunpcklps_avx(auVar122,auVar123);
            auVar79 = vunpcklps_avx(auVar61,auVar51);
            auVar123 = vunpckhps_avx(auVar61,auVar51);
            auVar61 = vunpcklps_avx(auVar43,auVar60);
            auVar51 = vunpckhps_avx(auVar43,auVar60);
            auVar80 = vunpcklps_avx(auVar44,auVar63);
            auVar60 = vunpckhps_avx(auVar44,auVar63);
            auVar122 = *(undefined1 (*) [16])(lVar24 + uVar35 * 4);
            auVar63 = vunpcklps_avx(auVar51,auVar60);
            auVar43 = vunpcklps_avx(auVar61,auVar80);
            auVar51 = vunpckhps_avx(auVar61,auVar80);
            auVar60 = vunpcklps_avx(auVar77,auVar76);
            auVar76 = vunpckhps_avx(auVar77,auVar76);
            auVar61 = vunpcklps_avx(auVar42,auVar122);
            auVar122 = vunpckhps_avx(auVar42,auVar122);
            auVar42 = *(undefined1 (*) [16])(lVar24 + uVar22 * 4);
            auVar77 = vunpcklps_avx(auVar76,auVar122);
            auVar80 = vunpcklps_avx(auVar60,auVar61);
            auVar122 = vunpckhps_avx(auVar60,auVar61);
            auVar61 = vunpcklps_avx(auVar78,auVar42);
            auVar60 = vunpckhps_avx(auVar78,auVar42);
            auVar42 = *(undefined1 (*) [16])(lVar24 + uVar30 * 4);
            auVar76 = *(undefined1 (*) [16])(lVar24 + uVar31 * 4);
            auVar78 = vunpcklps_avx(auVar42,auVar76);
            auVar42 = vunpckhps_avx(auVar42,auVar76);
            auVar44 = vunpcklps_avx(auVar60,auVar42);
            auVar52 = vunpcklps_avx(auVar61,auVar78);
            auVar60 = vunpckhps_avx(auVar61,auVar78);
            auVar42 = *(undefined1 (*) [16])(lVar24 + uVar29 * 4);
            auVar76 = *(undefined1 (*) [16])(lVar24 + uVar21 * 4);
            auVar78 = vunpcklps_avx(auVar42,auVar76);
            auVar61 = vunpckhps_avx(auVar42,auVar76);
            auVar42 = *(undefined1 (*) [16])(lVar24 + uVar38 * 4);
            auVar76 = *(undefined1 (*) [16])(lVar24 + uVar27 * 4);
            auVar53 = vunpcklps_avx(auVar42,auVar76);
            auVar42 = vunpckhps_avx(auVar42,auVar76);
            auVar65 = vunpcklps_avx(auVar61,auVar42);
            auVar66 = vunpcklps_avx(auVar78,auVar53);
            auVar61 = vunpckhps_avx(auVar78,auVar53);
            auVar42 = vshufps_avx(ZEXT416((uint)fVar93),ZEXT416((uint)fVar93),0);
            auVar76 = vshufps_avx(ZEXT416((uint)(1.0 - fVar93)),ZEXT416((uint)(1.0 - fVar93)),0);
            fVar74 = auVar42._0_4_;
            fVar88 = auVar42._4_4_;
            fVar90 = auVar42._8_4_;
            fVar92 = auVar42._12_4_;
            fVar93 = auVar76._0_4_;
            fVar102 = auVar76._4_4_;
            fVar155 = auVar76._8_4_;
            fVar157 = auVar76._12_4_;
            auVar118._0_4_ = fVar93 * auVar98._0_4_ + fVar74 * auVar80._0_4_;
            auVar118._4_4_ = fVar102 * auVar98._4_4_ + fVar88 * auVar80._4_4_;
            auVar118._8_4_ = fVar155 * auVar98._8_4_ + fVar90 * auVar80._8_4_;
            auVar118._12_4_ = fVar157 * auVar98._12_4_ + fVar92 * auVar80._12_4_;
            auVar124._0_4_ = fVar93 * auVar41._0_4_ + fVar74 * auVar122._0_4_;
            auVar124._4_4_ = fVar102 * auVar41._4_4_ + fVar88 * auVar122._4_4_;
            auVar124._8_4_ = fVar155 * auVar41._8_4_ + fVar90 * auVar122._8_4_;
            auVar124._12_4_ = fVar157 * auVar41._12_4_ + fVar92 * auVar122._12_4_;
            local_a58._0_4_ = auVar97._0_4_;
            local_a58._4_4_ = auVar97._4_4_;
            fStack_a50 = auVar97._8_4_;
            fStack_a4c = auVar97._12_4_;
            auVar99._0_4_ = fVar93 * (float)local_a58._0_4_ + fVar74 * auVar77._0_4_;
            auVar99._4_4_ = fVar102 * (float)local_a58._4_4_ + fVar88 * auVar77._4_4_;
            auVar99._8_4_ = fVar155 * fStack_a50 + fVar90 * auVar77._8_4_;
            auVar99._12_4_ = fVar157 * fStack_a4c + fVar92 * auVar77._12_4_;
            auVar138._0_4_ = fVar93 * auVar79._0_4_ + fVar74 * auVar52._0_4_;
            auVar138._4_4_ = fVar102 * auVar79._4_4_ + fVar88 * auVar52._4_4_;
            auVar138._8_4_ = fVar155 * auVar79._8_4_ + fVar90 * auVar52._8_4_;
            auVar138._12_4_ = fVar157 * auVar79._12_4_ + fVar92 * auVar52._12_4_;
            auVar107._0_4_ = fVar93 * auVar123._0_4_ + fVar74 * auVar60._0_4_;
            auVar107._4_4_ = fVar102 * auVar123._4_4_ + fVar88 * auVar60._4_4_;
            auVar107._8_4_ = fVar155 * auVar123._8_4_ + fVar90 * auVar60._8_4_;
            auVar107._12_4_ = fVar157 * auVar123._12_4_ + fVar92 * auVar60._12_4_;
            puVar2 = (undefined8 *)(uVar33 + 0x30 + lVar28);
            local_898 = *puVar2;
            uStack_890 = puVar2[1];
            puVar2 = (undefined8 *)(uVar33 + 0x40 + lVar28);
            local_ac8 = auVar62._0_4_;
            fStack_ac4 = auVar62._4_4_;
            fStack_ac0 = auVar62._8_4_;
            fStack_abc = auVar62._12_4_;
            auVar52._0_4_ = fVar93 * local_ac8 + fVar74 * auVar44._0_4_;
            auVar52._4_4_ = fVar102 * fStack_ac4 + fVar88 * auVar44._4_4_;
            auVar52._8_4_ = fVar155 * fStack_ac0 + fVar90 * auVar44._8_4_;
            auVar52._12_4_ = fVar157 * fStack_abc + fVar92 * auVar44._12_4_;
            local_a48._0_4_ = auVar43._0_4_;
            local_a48._4_4_ = auVar43._4_4_;
            fStack_a40 = auVar43._8_4_;
            fStack_a3c = auVar43._12_4_;
            auVar64._0_4_ = fVar93 * (float)local_a48._0_4_ + fVar74 * auVar66._0_4_;
            auVar64._4_4_ = fVar102 * (float)local_a48._4_4_ + fVar88 * auVar66._4_4_;
            auVar64._8_4_ = fVar155 * fStack_a40 + fVar90 * auVar66._8_4_;
            auVar64._12_4_ = fVar157 * fStack_a3c + fVar92 * auVar66._12_4_;
            local_b18 = auVar51._0_4_;
            fStack_b14 = auVar51._4_4_;
            fStack_b10 = auVar51._8_4_;
            fStack_b0c = auVar51._12_4_;
            auVar170._0_4_ = fVar93 * local_b18 + fVar74 * auVar61._0_4_;
            auVar170._4_4_ = fVar102 * fStack_b14 + fVar88 * auVar61._4_4_;
            auVar170._8_4_ = fVar155 * fStack_b10 + fVar90 * auVar61._8_4_;
            auVar170._12_4_ = fVar157 * fStack_b0c + fVar92 * auVar61._12_4_;
            local_b08 = auVar63._0_4_;
            fStack_b04 = auVar63._4_4_;
            fStack_b00 = auVar63._8_4_;
            fStack_afc = auVar63._12_4_;
            auVar148._0_4_ = fVar74 * auVar65._0_4_ + fVar93 * local_b08;
            auVar148._4_4_ = fVar88 * auVar65._4_4_ + fVar102 * fStack_b04;
            auVar148._8_4_ = fVar90 * auVar65._8_4_ + fVar155 * fStack_b00;
            auVar148._12_4_ = fVar92 * auVar65._12_4_ + fVar157 * fStack_afc;
            local_8a8 = *puVar2;
            uStack_8a0 = puVar2[1];
            uVar25 = *(undefined4 *)&(ray->org).field_0;
            auVar153._4_4_ = uVar25;
            auVar153._0_4_ = uVar25;
            auVar153._8_4_ = uVar25;
            auVar153._12_4_ = uVar25;
            uVar25 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
            auVar159._4_4_ = uVar25;
            auVar159._0_4_ = uVar25;
            auVar159._8_4_ = uVar25;
            auVar159._12_4_ = uVar25;
            uVar25 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
            auVar162._4_4_ = uVar25;
            auVar162._0_4_ = uVar25;
            auVar162._8_4_ = uVar25;
            auVar162._12_4_ = uVar25;
            _local_a48 = vsubps_avx(auVar118,auVar153);
            _local_a58 = vsubps_avx(auVar124,auVar159);
            auVar42 = vsubps_avx(auVar99,auVar162);
            auVar76 = vsubps_avx(auVar138,auVar153);
            auVar122 = vsubps_avx(auVar107,auVar159);
            auVar123 = vsubps_avx(auVar52,auVar162);
            auVar41 = vsubps_avx(auVar64,auVar153);
            auVar51 = vsubps_avx(auVar170,auVar159);
            auVar60 = vsubps_avx(auVar148,auVar162);
            auVar61 = vsubps_avx(auVar41,_local_a48);
            auVar62 = vsubps_avx(auVar51,_local_a58);
            auVar63 = vsubps_avx(auVar60,auVar42);
            fVar155 = local_a58._0_4_;
            fVar93 = auVar51._0_4_ + fVar155;
            fVar88 = local_a58._4_4_;
            fVar102 = auVar51._4_4_ + fVar88;
            fVar10 = local_a58._8_4_;
            fVar103 = auVar51._8_4_ + fVar10;
            fVar13 = local_a58._12_4_;
            fVar104 = auVar51._12_4_ + fVar13;
            fVar157 = auVar42._0_4_;
            fVar105 = auVar60._0_4_ + fVar157;
            fVar90 = auVar42._4_4_;
            fVar112 = auVar60._4_4_ + fVar90;
            fVar11 = auVar42._8_4_;
            fVar114 = auVar60._8_4_ + fVar11;
            fVar14 = auVar42._12_4_;
            fVar116 = auVar60._12_4_ + fVar14;
            fVar73 = auVar63._0_4_;
            auVar139._0_4_ = fVar73 * fVar93;
            fVar48 = auVar63._4_4_;
            auVar139._4_4_ = fVar48 * fVar102;
            fVar49 = auVar63._8_4_;
            auVar139._8_4_ = fVar49 * fVar103;
            fVar50 = auVar63._12_4_;
            auVar139._12_4_ = fVar50 * fVar104;
            fVar169 = auVar62._0_4_;
            auVar149._0_4_ = fVar169 * fVar105;
            fVar171 = auVar62._4_4_;
            auVar149._4_4_ = fVar171 * fVar112;
            fVar172 = auVar62._8_4_;
            auVar149._8_4_ = fVar172 * fVar114;
            fVar173 = auVar62._12_4_;
            auVar149._12_4_ = fVar173 * fVar116;
            auVar62 = vsubps_avx(auVar149,auVar139);
            fVar74 = local_a48._0_4_;
            fVar136 = auVar41._0_4_ + fVar74;
            fVar92 = local_a48._4_4_;
            fVar142 = auVar41._4_4_ + fVar92;
            fVar12 = local_a48._8_4_;
            fVar144 = auVar41._8_4_ + fVar12;
            fVar15 = local_a48._12_4_;
            fVar146 = auVar41._12_4_ + fVar15;
            fVar160 = auVar61._0_4_;
            auVar108._0_4_ = fVar160 * fVar105;
            fVar163 = auVar61._4_4_;
            auVar108._4_4_ = fVar163 * fVar112;
            fVar165 = auVar61._8_4_;
            auVar108._8_4_ = fVar165 * fVar114;
            fVar167 = auVar61._12_4_;
            auVar108._12_4_ = fVar167 * fVar116;
            auVar150._0_4_ = fVar136 * fVar73;
            auVar150._4_4_ = fVar142 * fVar48;
            auVar150._8_4_ = fVar144 * fVar49;
            auVar150._12_4_ = fVar146 * fVar50;
            auVar61 = vsubps_avx(auVar150,auVar108);
            auVar140._0_4_ = fVar169 * fVar136;
            auVar140._4_4_ = fVar171 * fVar142;
            auVar140._8_4_ = fVar172 * fVar144;
            auVar140._12_4_ = fVar173 * fVar146;
            auVar100._0_4_ = fVar160 * fVar93;
            auVar100._4_4_ = fVar163 * fVar102;
            auVar100._8_4_ = fVar165 * fVar103;
            auVar100._12_4_ = fVar167 * fVar104;
            auVar63 = vsubps_avx(auVar100,auVar140);
            fVar93 = (ray->dir).field_0.m128[2];
            fVar102 = (ray->dir).field_0.m128[1];
            local_ab8._4_4_ = fVar102;
            local_ab8._0_4_ = fVar102;
            local_ab8._8_4_ = fVar102;
            local_ab8._12_4_ = fVar102;
            fStack_ac4 = (ray->dir).field_0.m128[0];
            local_888._0_4_ =
                 fStack_ac4 * auVar62._0_4_ + fVar102 * auVar61._0_4_ + fVar93 * auVar63._0_4_;
            local_888._4_4_ =
                 fStack_ac4 * auVar62._4_4_ + fVar102 * auVar61._4_4_ + fVar93 * auVar63._4_4_;
            local_888._8_4_ =
                 fStack_ac4 * auVar62._8_4_ + fVar102 * auVar61._8_4_ + fVar93 * auVar63._8_4_;
            local_888._12_4_ =
                 fStack_ac4 * auVar62._12_4_ + fVar102 * auVar61._12_4_ + fVar93 * auVar63._12_4_;
            auVar61 = vsubps_avx(_local_a58,auVar122);
            auVar42 = vsubps_avx(auVar42,auVar123);
            fVar104 = fVar155 + auVar122._0_4_;
            fVar112 = fVar88 + auVar122._4_4_;
            fVar116 = fVar10 + auVar122._8_4_;
            fVar142 = fVar13 + auVar122._12_4_;
            fVar146 = auVar123._0_4_ + fVar157;
            fVar113 = auVar123._4_4_ + fVar90;
            fVar115 = auVar123._8_4_ + fVar11;
            fVar117 = auVar123._12_4_ + fVar14;
            fVar161 = auVar42._0_4_;
            auVar125._0_4_ = fVar161 * fVar104;
            fVar164 = auVar42._4_4_;
            auVar125._4_4_ = fVar164 * fVar112;
            fVar166 = auVar42._8_4_;
            auVar125._8_4_ = fVar166 * fVar116;
            fVar168 = auVar42._12_4_;
            auVar125._12_4_ = fVar168 * fVar142;
            fVar103 = auVar61._0_4_;
            auVar81._0_4_ = fVar103 * fVar146;
            fVar105 = auVar61._4_4_;
            auVar81._4_4_ = fVar105 * fVar113;
            fVar114 = auVar61._8_4_;
            auVar81._8_4_ = fVar114 * fVar115;
            fVar136 = auVar61._12_4_;
            auVar81._12_4_ = fVar136 * fVar117;
            auVar42 = vsubps_avx(auVar81,auVar125);
            auVar61 = vsubps_avx(_local_a48,auVar76);
            fVar144 = auVar61._0_4_;
            auVar109._0_4_ = fVar144 * fVar146;
            fVar146 = auVar61._4_4_;
            auVar109._4_4_ = fVar146 * fVar113;
            fVar113 = auVar61._8_4_;
            auVar109._8_4_ = fVar113 * fVar115;
            fVar115 = auVar61._12_4_;
            auVar109._12_4_ = fVar115 * fVar117;
            fVar117 = fVar74 + auVar76._0_4_;
            fVar133 = fVar92 + auVar76._4_4_;
            fVar134 = fVar12 + auVar76._8_4_;
            fVar135 = fVar15 + auVar76._12_4_;
            auVar141._0_4_ = fVar161 * fVar117;
            auVar141._4_4_ = fVar164 * fVar133;
            auVar141._8_4_ = fVar166 * fVar134;
            auVar141._12_4_ = fVar168 * fVar135;
            auVar61 = vsubps_avx(auVar141,auVar109);
            auVar126._0_4_ = fVar103 * fVar117;
            auVar126._4_4_ = fVar105 * fVar133;
            auVar126._8_4_ = fVar114 * fVar134;
            auVar126._12_4_ = fVar136 * fVar135;
            auVar101._0_4_ = fVar144 * fVar104;
            auVar101._4_4_ = fVar146 * fVar112;
            auVar101._8_4_ = fVar113 * fVar116;
            auVar101._12_4_ = fVar115 * fVar142;
            auVar62 = vsubps_avx(auVar101,auVar126);
            local_878._0_4_ =
                 fStack_ac4 * auVar42._0_4_ + fVar102 * auVar61._0_4_ + fVar93 * auVar62._0_4_;
            local_878._4_4_ =
                 fStack_ac4 * auVar42._4_4_ + fVar102 * auVar61._4_4_ + fVar93 * auVar62._4_4_;
            local_878._8_4_ =
                 fStack_ac4 * auVar42._8_4_ + fVar102 * auVar61._8_4_ + fVar93 * auVar62._8_4_;
            local_878._12_4_ =
                 fStack_ac4 * auVar42._12_4_ + fVar102 * auVar61._12_4_ + fVar93 * auVar62._12_4_;
            auVar42 = vsubps_avx(auVar76,auVar41);
            fVar72 = auVar76._0_4_ + auVar41._0_4_;
            fVar87 = auVar76._4_4_ + auVar41._4_4_;
            fVar89 = auVar76._8_4_ + auVar41._8_4_;
            fVar91 = auVar76._12_4_ + auVar41._12_4_;
            auVar76 = vsubps_avx(auVar122,auVar51);
            fVar117 = auVar122._0_4_ + auVar51._0_4_;
            fVar133 = auVar122._4_4_ + auVar51._4_4_;
            fVar134 = auVar122._8_4_ + auVar51._8_4_;
            fVar135 = auVar122._12_4_ + auVar51._12_4_;
            auVar122 = vsubps_avx(auVar123,auVar60);
            fVar104 = auVar123._0_4_ + auVar60._0_4_;
            fVar112 = auVar123._4_4_ + auVar60._4_4_;
            fVar116 = auVar123._8_4_ + auVar60._8_4_;
            fVar142 = auVar123._12_4_ + auVar60._12_4_;
            fVar137 = auVar122._0_4_;
            auVar53._0_4_ = fVar137 * fVar117;
            fVar143 = auVar122._4_4_;
            auVar53._4_4_ = fVar143 * fVar133;
            fVar145 = auVar122._8_4_;
            auVar53._8_4_ = fVar145 * fVar134;
            fVar147 = auVar122._12_4_;
            auVar53._12_4_ = fVar147 * fVar135;
            fVar152 = auVar76._0_4_;
            auVar127._0_4_ = fVar152 * fVar104;
            fVar154 = auVar76._4_4_;
            auVar127._4_4_ = fVar154 * fVar112;
            fVar156 = auVar76._8_4_;
            auVar127._8_4_ = fVar156 * fVar116;
            fVar158 = auVar76._12_4_;
            auVar127._12_4_ = fVar158 * fVar142;
            auVar76 = vsubps_avx(auVar127,auVar53);
            fVar106 = auVar42._0_4_;
            auVar43._0_4_ = fVar106 * fVar104;
            fVar104 = auVar42._4_4_;
            auVar43._4_4_ = fVar104 * fVar112;
            fVar112 = auVar42._8_4_;
            auVar43._8_4_ = fVar112 * fVar116;
            fVar116 = auVar42._12_4_;
            auVar43._12_4_ = fVar116 * fVar142;
            auVar128._0_4_ = fVar137 * fVar72;
            auVar128._4_4_ = fVar143 * fVar87;
            auVar128._8_4_ = fVar145 * fVar89;
            auVar128._12_4_ = fVar147 * fVar91;
            auVar42 = vsubps_avx(auVar128,auVar43);
            auVar132 = ZEXT1664(local_a68);
            auVar82._0_4_ = fVar152 * fVar72;
            auVar82._4_4_ = fVar154 * fVar87;
            auVar82._8_4_ = fVar156 * fVar89;
            auVar82._12_4_ = fVar158 * fVar91;
            auVar65._0_4_ = fVar106 * fVar117;
            auVar65._4_4_ = fVar104 * fVar133;
            auVar65._8_4_ = fVar112 * fVar134;
            auVar65._12_4_ = fVar116 * fVar135;
            auVar122 = vsubps_avx(auVar65,auVar82);
            local_ac8 = fStack_ac4;
            fStack_ac0 = fStack_ac4;
            fStack_abc = fStack_ac4;
            auVar44._0_4_ =
                 fStack_ac4 * auVar76._0_4_ + fVar102 * auVar42._0_4_ + fVar93 * auVar122._0_4_;
            auVar44._4_4_ =
                 fStack_ac4 * auVar76._4_4_ + fVar102 * auVar42._4_4_ + fVar93 * auVar122._4_4_;
            auVar44._8_4_ =
                 fStack_ac4 * auVar76._8_4_ + fVar102 * auVar42._8_4_ + fVar93 * auVar122._8_4_;
            auVar44._12_4_ =
                 fStack_ac4 * auVar76._12_4_ + fVar102 * auVar42._12_4_ + fVar93 * auVar122._12_4_;
            local_868._0_4_ = auVar44._0_4_ + local_888._0_4_ + local_878._0_4_;
            local_868._4_4_ = auVar44._4_4_ + local_888._4_4_ + local_878._4_4_;
            local_868._8_4_ = auVar44._8_4_ + local_888._8_4_ + local_878._8_4_;
            local_868._12_4_ = auVar44._12_4_ + local_888._12_4_ + local_878._12_4_;
            auVar42 = vminps_avx(local_888,local_878);
            auVar76 = vminps_avx(auVar42,auVar44);
            auVar66._8_4_ = 0x7fffffff;
            auVar66._0_8_ = 0x7fffffff7fffffff;
            auVar66._12_4_ = 0x7fffffff;
            auVar42 = vandps_avx(local_868,auVar66);
            auVar67._0_4_ = auVar42._0_4_ * 1.1920929e-07;
            auVar67._4_4_ = auVar42._4_4_ * 1.1920929e-07;
            auVar67._8_4_ = auVar42._8_4_ * 1.1920929e-07;
            auVar67._12_4_ = auVar42._12_4_ * 1.1920929e-07;
            uVar29 = CONCAT44(auVar67._4_4_,auVar67._0_4_);
            auVar83._0_8_ = uVar29 ^ 0x8000000080000000;
            auVar83._8_4_ = -auVar67._8_4_;
            auVar83._12_4_ = -auVar67._12_4_;
            auVar76 = vcmpps_avx(auVar76,auVar83,5);
            auVar122 = vmaxps_avx(local_888,local_878);
            auVar122 = vmaxps_avx(auVar122,auVar44);
            auVar122 = vcmpps_avx(auVar122,auVar67,2);
            auVar76 = vorps_avx(auVar76,auVar122);
            mapUV = (UVIdentity<4>)0x0;
            local_858 = &mapUV;
            auVar122 = auVar20 & auVar76;
            if ((((auVar122 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar122 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar122 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar122[0xf] < '\0') {
              auVar45._0_4_ = fVar73 * fVar103;
              auVar45._4_4_ = fVar48 * fVar105;
              auVar45._8_4_ = fVar49 * fVar114;
              auVar45._12_4_ = fVar50 * fVar136;
              auVar54._0_4_ = fVar169 * fVar161;
              auVar54._4_4_ = fVar171 * fVar164;
              auVar54._8_4_ = fVar172 * fVar166;
              auVar54._12_4_ = fVar173 * fVar168;
              auVar41 = vsubps_avx(auVar54,auVar45);
              auVar68._0_4_ = fVar152 * fVar161;
              auVar68._4_4_ = fVar154 * fVar164;
              auVar68._8_4_ = fVar156 * fVar166;
              auVar68._12_4_ = fVar158 * fVar168;
              auVar84._0_4_ = fVar103 * fVar137;
              auVar84._4_4_ = fVar105 * fVar143;
              auVar84._8_4_ = fVar114 * fVar145;
              auVar84._12_4_ = fVar136 * fVar147;
              auVar51 = vsubps_avx(auVar84,auVar68);
              auVar129._8_4_ = 0x7fffffff;
              auVar129._0_8_ = 0x7fffffff7fffffff;
              auVar129._12_4_ = 0x7fffffff;
              auVar122 = vandps_avx(auVar45,auVar129);
              auVar123 = vandps_avx(auVar68,auVar129);
              auVar122 = vcmpps_avx(auVar122,auVar123,1);
              local_808 = vblendvps_avx(auVar51,auVar41,auVar122);
              auVar55._0_4_ = fVar144 * fVar137;
              auVar55._4_4_ = fVar146 * fVar143;
              auVar55._8_4_ = fVar113 * fVar145;
              auVar55._12_4_ = fVar115 * fVar147;
              auVar69._0_4_ = fVar73 * fVar144;
              auVar69._4_4_ = fVar48 * fVar146;
              auVar69._8_4_ = fVar49 * fVar113;
              auVar69._12_4_ = fVar50 * fVar115;
              auVar85._0_4_ = fVar160 * fVar161;
              auVar85._4_4_ = fVar163 * fVar164;
              auVar85._8_4_ = fVar165 * fVar166;
              auVar85._12_4_ = fVar167 * fVar168;
              auVar41 = vsubps_avx(auVar69,auVar85);
              auVar119._0_4_ = fVar161 * fVar106;
              auVar119._4_4_ = fVar164 * fVar104;
              auVar119._8_4_ = fVar166 * fVar112;
              auVar119._12_4_ = fVar168 * fVar116;
              auVar51 = vsubps_avx(auVar119,auVar55);
              auVar122 = vandps_avx(auVar85,auVar129);
              auVar123 = vandps_avx(auVar55,auVar129);
              auVar122 = vcmpps_avx(auVar122,auVar123,1);
              local_7f8 = vblendvps_avx(auVar51,auVar41,auVar122);
              auVar70._0_4_ = fVar103 * fVar106;
              auVar70._4_4_ = fVar105 * fVar104;
              auVar70._8_4_ = fVar114 * fVar112;
              auVar70._12_4_ = fVar136 * fVar116;
              auVar86._0_4_ = fVar160 * fVar103;
              auVar86._4_4_ = fVar163 * fVar105;
              auVar86._8_4_ = fVar165 * fVar114;
              auVar86._12_4_ = fVar167 * fVar136;
              auVar110._0_4_ = fVar169 * fVar144;
              auVar110._4_4_ = fVar171 * fVar146;
              auVar110._8_4_ = fVar172 * fVar113;
              auVar110._12_4_ = fVar173 * fVar115;
              auVar120._0_4_ = fVar144 * fVar152;
              auVar120._4_4_ = fVar146 * fVar154;
              auVar120._8_4_ = fVar113 * fVar156;
              auVar120._12_4_ = fVar115 * fVar158;
              auVar41 = vsubps_avx(auVar86,auVar110);
              auVar51 = vsubps_avx(auVar120,auVar70);
              auVar122 = vandps_avx(auVar110,auVar129);
              auVar123 = vandps_avx(auVar70,auVar129);
              auVar122 = vcmpps_avx(auVar122,auVar123,1);
              local_7e8 = vblendvps_avx(auVar51,auVar41,auVar122);
              fVar73 = local_808._0_4_ * fStack_ac4 +
                       local_7f8._0_4_ * fVar102 + local_7e8._0_4_ * fVar93;
              fVar103 = local_808._4_4_ * fStack_ac4 +
                        local_7f8._4_4_ * fVar102 + local_7e8._4_4_ * fVar93;
              fVar104 = local_808._8_4_ * fStack_ac4 +
                        local_7f8._8_4_ * fVar102 + local_7e8._8_4_ * fVar93;
              fVar93 = local_808._12_4_ * fStack_ac4 +
                       local_7f8._12_4_ * fVar102 + local_7e8._12_4_ * fVar93;
              auVar111._0_4_ = fVar73 + fVar73;
              auVar111._4_4_ = fVar103 + fVar103;
              auVar111._8_4_ = fVar104 + fVar104;
              auVar111._12_4_ = fVar93 + fVar93;
              fVar74 = local_808._0_4_ * fVar74 +
                       local_7f8._0_4_ * fVar155 + local_7e8._0_4_ * fVar157;
              fVar88 = local_808._4_4_ * fVar92 +
                       local_7f8._4_4_ * fVar88 + local_7e8._4_4_ * fVar90;
              fVar90 = local_808._8_4_ * fVar12 +
                       local_7f8._8_4_ * fVar10 + local_7e8._8_4_ * fVar11;
              fVar92 = local_808._12_4_ * fVar15 +
                       local_7f8._12_4_ * fVar13 + local_7e8._12_4_ * fVar14;
              auVar122 = vrcpps_avx(auVar111);
              fVar93 = auVar122._0_4_;
              auVar130._0_4_ = auVar111._0_4_ * fVar93;
              fVar102 = auVar122._4_4_;
              auVar130._4_4_ = auVar111._4_4_ * fVar102;
              fVar155 = auVar122._8_4_;
              auVar130._8_4_ = auVar111._8_4_ * fVar155;
              fVar157 = auVar122._12_4_;
              auVar130._12_4_ = auVar111._12_4_ * fVar157;
              auVar151._8_4_ = 0x3f800000;
              auVar151._0_8_ = &DAT_3f8000003f800000;
              auVar151._12_4_ = 0x3f800000;
              auVar122 = vsubps_avx(auVar151,auVar130);
              local_818._0_4_ = (fVar74 + fVar74) * (fVar93 + fVar93 * auVar122._0_4_);
              local_818._4_4_ = (fVar88 + fVar88) * (fVar102 + fVar102 * auVar122._4_4_);
              local_818._8_4_ = (fVar90 + fVar90) * (fVar155 + fVar155 * auVar122._8_4_);
              local_818._12_4_ = (fVar92 + fVar92) * (fVar157 + fVar157 * auVar122._12_4_);
              uVar25 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
              auVar121._4_4_ = uVar25;
              auVar121._0_4_ = uVar25;
              auVar121._8_4_ = uVar25;
              auVar121._12_4_ = uVar25;
              auVar122 = vcmpps_avx(auVar121,local_818,2);
              fVar93 = ray->tfar;
              auVar131._4_4_ = fVar93;
              auVar131._0_4_ = fVar93;
              auVar131._8_4_ = fVar93;
              auVar131._12_4_ = fVar93;
              auVar123 = vcmpps_avx(local_818,auVar131,2);
              auVar122 = vandps_avx(auVar122,auVar123);
              auVar132 = ZEXT1664(local_a68);
              auVar123 = vcmpps_avx(auVar111,_DAT_01feba10,4);
              auVar122 = vandps_avx(auVar123,auVar122);
              auVar76 = vandps_avx(auVar76,auVar20);
              auVar122 = vpslld_avx(auVar122,0x1f);
              auVar123 = vpsrad_avx(auVar122,0x1f);
              auVar122 = auVar76 & auVar123;
              if ((((auVar122 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar122 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar122 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar122[0xf] < '\0') {
                local_848 = vandps_avx(auVar123,auVar76);
                auVar76 = vrcpps_avx(local_868);
                fVar93 = auVar76._0_4_;
                auVar56._0_4_ = local_868._0_4_ * fVar93;
                fVar102 = auVar76._4_4_;
                auVar56._4_4_ = local_868._4_4_ * fVar102;
                fVar155 = auVar76._8_4_;
                auVar56._8_4_ = local_868._8_4_ * fVar155;
                fVar157 = auVar76._12_4_;
                auVar56._12_4_ = local_868._12_4_ * fVar157;
                auVar71._8_4_ = 0x3f800000;
                auVar71._0_8_ = &DAT_3f8000003f800000;
                auVar71._12_4_ = 0x3f800000;
                auVar76 = vsubps_avx(auVar71,auVar56);
                auVar46._0_4_ = fVar93 + fVar93 * auVar76._0_4_;
                auVar46._4_4_ = fVar102 + fVar102 * auVar76._4_4_;
                auVar46._8_4_ = fVar155 + fVar155 * auVar76._8_4_;
                auVar46._12_4_ = fVar157 + fVar157 * auVar76._12_4_;
                auVar57._8_4_ = 0x219392ef;
                auVar57._0_8_ = 0x219392ef219392ef;
                auVar57._12_4_ = 0x219392ef;
                auVar42 = vcmpps_avx(auVar42,auVar57,5);
                auVar42 = vandps_avx(auVar42,auVar46);
                auVar58._0_4_ = local_888._0_4_ * auVar42._0_4_;
                auVar58._4_4_ = local_888._4_4_ * auVar42._4_4_;
                auVar58._8_4_ = local_888._8_4_ * auVar42._8_4_;
                auVar58._12_4_ = local_888._12_4_ * auVar42._12_4_;
                local_838 = vminps_avx(auVar58,auVar71);
                auVar47._0_4_ = local_878._0_4_ * auVar42._0_4_;
                auVar47._4_4_ = local_878._4_4_ * auVar42._4_4_;
                auVar47._8_4_ = local_878._8_4_ * auVar42._8_4_;
                auVar47._12_4_ = local_878._12_4_ * auVar42._12_4_;
                local_828 = vminps_avx(auVar47,auVar71);
                uVar34 = vmovmskps_avx(local_848);
                uVar29 = (ulong)uVar34;
                do {
                  uVar30 = 0;
                  if (uVar29 != 0) {
                    for (; (uVar29 >> uVar30 & 1) == 0; uVar30 = uVar30 + 1) {
                    }
                  }
                  h.geomID = *(uint *)((long)&local_898 + uVar30 * 4);
                  pGVar8 = (pSVar7->geometries).items[h.geomID].ptr;
                  if ((pGVar8->mask & ray->mask) == 0) {
                    uVar29 = uVar29 ^ 1L << (uVar30 & 0x3f);
                    bVar19 = true;
                  }
                  else {
                    pRVar9 = context->args;
                    if ((pRVar9->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar8->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                      bVar19 = false;
                    }
                    else {
                      h.u = *(float *)(local_838 + uVar30 * 4);
                      h.v = *(float *)(local_828 + uVar30 * 4);
                      args.context = context->user;
                      h.primID = *(uint *)((long)&local_8a8 + uVar30 * 4);
                      h.Ng.field_0.field_0.x = (float)*(undefined4 *)(local_808 + uVar30 * 4);
                      h.Ng.field_0.field_0.y = (float)*(undefined4 *)(local_7f8 + uVar30 * 4);
                      h.Ng.field_0.field_0.z = (float)*(undefined4 *)(local_7e8 + uVar30 * 4);
                      h.instID[0] = (args.context)->instID[0];
                      h.instPrimID[0] = (args.context)->instPrimID[0];
                      fVar93 = ray->tfar;
                      ray->tfar = *(float *)(local_818 + uVar30 * 4);
                      local_acc = -1;
                      args.valid = &local_acc;
                      args.geometryUserPtr = pGVar8->userPtr;
                      args.hit = (RTCHitN *)&h;
                      args.N = 1;
                      args.ray = (RTCRayN *)ray;
                      if (pGVar8->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_002db495:
                        if (pRVar9->filter != (RTCFilterFunctionN)0x0) {
                          if (((pRVar9->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                             (((pGVar8->field_8).field_0x2 & 0x40) != 0)) {
                            (*pRVar9->filter)(&args);
                            auVar132 = ZEXT1664(local_a68);
                          }
                          if (*args.valid == 0) goto LAB_002db4de;
                        }
                        bVar19 = false;
                      }
                      else {
                        (*pGVar8->occlusionFilterN)(&args);
                        auVar132 = ZEXT1664(local_a68);
                        if (*args.valid != 0) goto LAB_002db495;
LAB_002db4de:
                        ray->tfar = fVar93;
                        uVar29 = uVar29 ^ 1L << (uVar30 & 0x3f);
                        bVar19 = true;
                      }
                    }
                  }
                  iVar26 = 0;
                  if (!bVar19) {
                    uVar33 = local_a78;
                    uVar29 = local_a80;
                    uVar30 = local_a88;
                    uVar35 = local_aa0;
                    uVar36 = local_a90;
                    uVar38 = local_a98;
                    if (bVar40) {
                      ray->tfar = -INFINITY;
                      iVar26 = 3;
                    }
                    goto LAB_002db59e;
                  }
                } while (uVar29 != 0);
              }
            }
            local_a30 = local_a30 + 1;
            bVar40 = local_a30 < local_a38;
          } while (local_a30 != local_a38);
          iVar26 = 0;
          uVar33 = local_a78;
          uVar29 = local_a80;
          uVar30 = local_a88;
          uVar35 = local_aa0;
          uVar36 = local_a90;
          uVar38 = local_a98;
        }
      }
LAB_002db59e:
    } while (iVar26 != 3);
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }